

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_setup_dst_planes
               (macroblockd_plane *planes,BLOCK_SIZE bsize,YV12_BUFFER_CONFIG *src,int mi_row,
               int mi_col,int plane_start,int plane_end)

{
  macroblockd_plane *pmVar1;
  ulong uVar2;
  int iVar3;
  buf_2d *dst;
  long lVar4;
  
  iVar3 = 3;
  if (plane_end < 3) {
    iVar3 = plane_end;
  }
  lVar4 = (long)plane_start;
  pmVar1 = planes + lVar4;
  for (; dst = &pmVar1->dst, lVar4 < iVar3; lVar4 = lVar4 + 1) {
    uVar2 = (ulong)(0 < lVar4);
    setup_pred_plane(dst,bsize,src->store_buf_adr[lVar4 + -4],
                     *(int *)((long)src->store_buf_adr + uVar2 * 4 + -0x38),
                     *(int *)((long)src->store_buf_adr + uVar2 * 4 + -0x30),
                     *(int *)((long)src->store_buf_adr + uVar2 * 4 + -0x28),mi_row,mi_col,
                     (scale_factors *)0x0,*(int *)((long)(dst + -1) + 0x14),
                     *(int *)((long)(dst + -1) + 0x18));
    pmVar1 = (macroblockd_plane *)(dst + 0x51);
  }
  return;
}

Assistant:

void av1_setup_dst_planes(struct macroblockd_plane *planes, BLOCK_SIZE bsize,
                          const YV12_BUFFER_CONFIG *src, int mi_row, int mi_col,
                          const int plane_start, const int plane_end) {
  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = plane_start; i < AOMMIN(plane_end, MAX_MB_PLANE); ++i) {
    struct macroblockd_plane *const pd = &planes[i];
    const int is_uv = i > 0;
    setup_pred_plane(&pd->dst, bsize, src->buffers[i], src->crop_widths[is_uv],
                     src->crop_heights[is_uv], src->strides[is_uv], mi_row,
                     mi_col, NULL, pd->subsampling_x, pd->subsampling_y);
  }
}